

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-dark.c
# Opt level: O2

_Bool borg_flow_dark_reachable(int y,int x)

{
  _Bool _Var1;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 != 8; uVar2 = uVar2 + 1) {
    if (borg_grids[(long)ddy_ddd[uVar2] + (long)y][(long)ddx_ddd[uVar2] + (long)x].feat != '\0') {
      _Var1 = borg_cave_floor_grid
                        (borg_grids[(long)ddy_ddd[uVar2] + (long)y] + (long)ddx_ddd[uVar2] + (long)x
                        );
      if (_Var1) break;
    }
  }
  return uVar2 < 8;
}

Assistant:

static bool borg_flow_dark_reachable(int y, int x)
{
    int j;

    borg_grid *ag;

    /* Scan neighbors */
    for (j = 0; j < 8; j++) {
        int y2 = y + ddy_ddd[j];
        int x2 = x + ddx_ddd[j];

        /* Get the grid */
        ag = &borg_grids[y2][x2];

        /* Skip unknown grids (important) */
        if (ag->feat == FEAT_NONE)
            continue;

        /* Accept known floor grids */
        if (borg_cave_floor_grid(ag))
            return true;
    }

    /* Failure */
    return false;
}